

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::backward(Buffer *this,off_t offset)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  char *__src;
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xba,"void Liby::Buffer::backward(off_t)");
  }
  if (offset == 0) {
    sVar3 = this->capacity_ - this->rightIndex_;
    if (sVar3 == 0) {
      return;
    }
    memmove(this->buffer_ + this->leftIndex_ + (this->capacity_ - this->rightIndex_),
            this->buffer_ + this->leftIndex_,sVar3);
    lVar2 = this->capacity_;
    this->leftIndex_ = this->leftIndex_ + (lVar2 - this->rightIndex_);
  }
  else {
    lVar2 = this->leftIndex_;
    lVar1 = this->capacity_;
    sVar3 = (lVar1 - lVar2) - offset;
    if (sVar3 == 0 || lVar1 - lVar2 < offset) {
      this->rightIndex_ = lVar1;
      this->leftIndex_ = lVar1;
      return;
    }
    __src = this->buffer_ + lVar2;
    if (offset <= lVar1 - this->rightIndex_) {
      memmove(__src + offset,__src,this->rightIndex_ - lVar2);
      this->leftIndex_ = this->leftIndex_ + offset;
      this->rightIndex_ = this->rightIndex_ + offset;
      return;
    }
    memmove(__src + offset,__src,sVar3);
    lVar2 = this->capacity_;
    this->leftIndex_ = lVar2 - offset;
  }
  this->rightIndex_ = lVar2;
  return;
}

Assistant:

void Buffer::backward(off_t offset) {
    assert(offset >= 0);
    if (offset == 0) {
        if (rightIndex_ == capacity_) {
            return;
        }
        ::memmove(buffer_ + leftIndex_ + capacity_ - rightIndex_,
                  buffer_ + leftIndex_, capacity_ - rightIndex_);
        leftIndex_ += capacity_ - rightIndex_;
        rightIndex_ = capacity_;
    } else if (offset >= capacity_ - leftIndex_) {
        leftIndex_ = rightIndex_ = capacity_;
    } else if (offset <= capacity_ - rightIndex_) {
        ::memmove(buffer_ + leftIndex_ + offset, buffer_ + leftIndex_,
                  rightIndex_ - leftIndex_);
        leftIndex_ += offset;
        rightIndex_ += offset;
    } else {
        ::memmove(buffer_ + leftIndex_ + offset, buffer_ + leftIndex_,
                  capacity_ - leftIndex_ - offset);
        leftIndex_ += capacity_ - leftIndex_ - offset;
        rightIndex_ = capacity_;
    }
}